

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BuildHistograms(uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands
                    ,HistogramLiteral *lit_histo,HistogramCommand *cmd_histo,
                    HistogramDistance *dist_histo)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t i;
  size_t sVar6;
  long lVar7;
  
  for (sVar6 = 0; sVar6 != n_commands; sVar6 = sVar6 + 1) {
    uVar3 = commands[sVar6].insert_len_;
    uVar4 = commands[sVar6].copy_len_;
    uVar1 = commands[sVar6].cmd_prefix_;
    uVar2 = commands[sVar6].dist_prefix_;
    cmd_histo->data_[uVar1] = cmd_histo->data_[uVar1] + 1;
    cmd_histo->total_count_ = cmd_histo->total_count_ + 1;
    sVar5 = start_pos;
    for (lVar7 = 0; -lVar7 != (ulong)uVar3; lVar7 = lVar7 + -1) {
      lit_histo->data_[input[sVar5 & mask]] = lit_histo->data_[input[sVar5 & mask]] + 1;
      lit_histo->total_count_ = lit_histo->total_count_ + 1;
      sVar5 = sVar5 + 1;
    }
    uVar4 = uVar4 & 0xffffff;
    if ((uVar4 != 0) && (0x7f < uVar1)) {
      dist_histo->data_[uVar2] = dist_histo->data_[uVar2] + 1;
      dist_histo->total_count_ = dist_histo->total_count_ + 1;
    }
    start_pos = (start_pos + uVar4) - lVar7;
  }
  return;
}

Assistant:

static void BuildHistograms(const uint8_t* input,
                            size_t start_pos,
                            size_t mask,
                            const Command *commands,
                            size_t n_commands,
                            HistogramLiteral* lit_histo,
                            HistogramCommand* cmd_histo,
                            HistogramDistance* dist_histo) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t j;
    HistogramAddCommand(cmd_histo, cmd.cmd_prefix_);
    for (j = cmd.insert_len_; j != 0; --j) {
      HistogramAddLiteral(lit_histo, input[pos & mask]);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      HistogramAddDistance(dist_histo, cmd.dist_prefix_);
    }
  }
}